

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

string * __thiscall
tlx::CmdlineParser::Argument::option_text_abi_cxx11_(string *__return_storage_ptr__,Argument *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  Argument *local_18;
  Argument *this_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Argument *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this->key_ != '\0') {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'-');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,this->key_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"--");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&this->longkey_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_50,' ',&this->keytype_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string option_text() const {
        std::string s;
        if (key_ != 0) {
            s += '-', s += key_, s += ", ";
        }
        s += "--", s += longkey_;
        if (!keytype_.empty()) {
            s += ' ' + keytype_;
        }
        return s;
    }